

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O3

bool __thiscall
helics::apps::AsioBrokerServer::udpDataReceive
          (AsioBrokerServer *this,shared_ptr<helics::udp::UdpServer> *server,char *data,
          size_t bytes_received)

{
  pointer pcVar1;
  element_type *peVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  ActionMessage rep;
  ActionMessage m;
  string local_1c8;
  const_buffers_1 local_1a8;
  undefined1 local_198 [184];
  ActionMessage local_e0;
  
  ActionMessage::ActionMessage(&local_e0,data,(long)(int)bytes_received);
  if (((local_e0.messageAction == cmd_protocol_priority) ||
      (local_e0.messageAction == cmd_protocol_big)) || (local_e0.messageAction == cmd_protocol)) {
    TypedBrokerServer::generateMessageResponse
              ((ActionMessage *)local_198,&local_e0,&this->udpPortData,UDP);
    if (local_198._0_4_ != cmd_ignore) {
      peVar2 = (server->super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      ActionMessage::to_string_abi_cxx11_(&local_1c8,(ActionMessage *)local_198);
      local_1a8.super_const_buffer.size_ = local_1c8._M_string_length;
      ::asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::const_buffers_1>(&peVar2->mSocket,&local_1a8,&peVar2->mRemoteEndpoint);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    ActionMessage::~ActionMessage((ActionMessage *)local_198);
  }
  else if (bytes_received == 5) {
    pcVar1 = local_198 + 0x10;
    local_198._0_8_ = pcVar1;
    if (data == (char *)0x0) {
      uVar4 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      ActionMessage::~ActionMessage(&local_e0);
      _Unwind_Resume(uVar4);
    }
    local_198[0x14] = data[4];
    local_198._16_4_ = *(undefined4 *)data;
    local_198._8_8_ = 5;
    local_198[0x15] = '\0';
    iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                    "close");
    if ((pointer)local_198._0_8_ != pcVar1) {
      operator_delete((void *)local_198._0_8_,
                      CONCAT26(local_198._22_2_,
                               CONCAT15(local_198[0x15],CONCAT14(local_198[0x14],local_198._16_4_)))
                      + 1);
    }
    if (iVar3 == 0) {
      bVar5 = false;
      goto LAB_001c4fc8;
    }
  }
  bVar5 = true;
LAB_001c4fc8:
  ActionMessage::~ActionMessage(&local_e0);
  return bVar5;
}

Assistant:

bool AsioBrokerServer::udpDataReceive(const std::shared_ptr<udp::UdpServer>& server,
                                          const char* data,
                                          size_t bytes_received)
    {
        ActionMessage m(data, static_cast<int>(bytes_received));
        if (isProtocolCommand(m)) {
            // if the reply is not ignored respond with it otherwise
            // forward the original message on to the receiver to handle
            auto rep = generateMessageResponse(m, udpPortData, CoreType::UDP);
            if (rep.action() != CMD_IGNORE) {
                try {
                    server->reply(rep.to_string());
                }
                catch (const std::system_error&) {
                    return false;
                }
            }
        } else if (bytes_received == 5) {
            if (std::string(data, bytes_received) == "close") {
                return false;
            }
        }

        return true;
    }